

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleTypeHandler<3UL>::SetPropertyWithAttributes
          (SimpleTypeHandler<3UL> *this,DynamicObject *instance,PropertyId propertyId,Var value,
          PropertyAttributes attributes,PropertyValueInfo *info,PropertyOperationFlags flags,
          SideEffects possibleSideEffects)

{
  code *pcVar1;
  Var value_00;
  ScriptContext *this_00;
  bool bVar2;
  uint uVar3;
  BOOL BVar4;
  PropertyId propertyId_00;
  PathTypeHandlerBase *pPVar5;
  SimpleTypeHandler<3UL> *pSVar6;
  DynamicType *type;
  byte bVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  undefined7 in_register_00000081;
  ulong unaff_R14;
  ScriptContext *local_88;
  JavascriptLibrary *local_80;
  Var local_78;
  byte *local_70;
  uint32 local_64;
  PropertyValueInfo *pPStack_60;
  uint32 indexVal;
  ScriptContext *local_58;
  SimpleTypeHandler<3UL> *local_50;
  ScriptContext *local_48;
  DynamicObject *local_40;
  ulong local_38;
  
  uVar8 = CONCAT71(in_register_00000081,attributes) & 0xffffffff;
  iVar10 = this->propertyCount;
  bVar2 = 0 < iVar10;
  if (0 < iVar10) {
    if ((this->descriptors[0].Id.ptr)->pid == propertyId) {
      bVar2 = true;
      unaff_R14 = 0;
    }
    else {
      uVar3 = 1;
      do {
        unaff_R14 = (ulong)uVar3;
        uVar9 = uVar3 & 0xffff;
        bVar2 = (int)uVar9 < iVar10;
        if (iVar10 <= (int)uVar9) break;
        uVar3 = uVar9 + 1;
      } while (*(int *)(*(long *)((long)&this->descriptors[0].Id.ptr + (ulong)(uVar9 << 4)) + 8) !=
               propertyId);
    }
  }
  bVar7 = (byte)uVar8;
  pPStack_60 = info;
  if (!bVar2) {
    BVar4 = ScriptContext::IsNumericPropertyId
                      ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                       super_JavascriptLibraryBase).scriptContext.ptr,propertyId,&local_64);
    if (BVar4 != 0) {
      BVar4 = DynamicTypeHandler::SetItemWithAttributes
                        (&this->super_DynamicTypeHandler,instance,local_64,value,bVar7);
      return BVar4;
    }
    BVar4 = AddProperty(this,instance,propertyId,value,bVar7,pPStack_60,flags,possibleSideEffects);
    return BVar4;
  }
  uVar11 = unaff_R14 & 0xffff;
  iVar10 = (int)uVar11;
  local_70 = (byte *)((long)&this->descriptors[0].field_1 + (ulong)(uint)(iVar10 << 4));
  local_78 = value;
  local_40 = instance;
  if (*local_70 == bVar7) goto LAB_00e5480f;
  local_48 = (ScriptContext *)
             CONCAT44(local_48._4_4_,(int)CONCAT71(in_register_00000081,attributes));
  pSVar6 = this;
  type = (DynamicType *)value;
  local_38 = uVar11;
  if (((this->super_DynamicTypeHandler).flags & 4) == 0) {
LAB_00e54731:
    BVar4 = (BOOL)type;
    local_50 = pSVar6;
    if ((*local_70 & 8) != 0) {
      ScriptContext::InvalidateProtoCaches
                ((((((local_40->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
      iVar10 = (int)local_38;
    }
    *(char *)((long)&local_50->descriptors[0].field_1 + (ulong)(uint)(iVar10 << 4)) = (char)uVar8;
    if ((uVar8 & 1) != 0) {
      DynamicObject::SetHasNoEnumerableProperties(local_40,false);
    }
    local_80 = (((local_40->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
    local_58 = (ScriptContext *)&local_80->typesWithOnlyWritablePropertyProtoChain;
    Memory::Recycler::WBSetBit((char *)&local_88);
    local_88 = local_58;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_88);
    pSVar6 = local_50;
    if (((ulong)local_48 & 4) == 0) {
      local_48 = local_88;
      local_58 = (local_80->super_JavascriptLibraryBase).scriptContext.ptr;
      DynamicTypeHandler::SetHasOnlyWritableDataProperties
                (&local_50->super_DynamicTypeHandler,false);
      this_00 = local_58;
      if (((pSVar6->super_DynamicTypeHandler).flags & 0x20) != 0) {
        propertyId_00 = DynamicTypeHandler::TMapKey_GetPropertyId(local_58,propertyId);
        ScriptContext::InvalidateStoreFieldCaches(this_00,propertyId_00);
        PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
                  ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)local_48);
      }
    }
    bVar2 = true;
    iVar10 = (int)local_38;
  }
  else {
    type = (DynamicType *)(instance->super_RecyclableObject).type.ptr;
    bVar2 = DoConvertToPathType(type);
    local_50 = (SimpleTypeHandler<3UL> *)CONCAT71(local_50._1_7_,bVar2);
    if (bVar2) {
      pPVar5 = ConvertToPathType(this,instance);
      uVar3 = (*(pPVar5->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x3a])
                        (pPVar5,instance,(ulong)(uint)propertyId,local_78,(ulong)local_48 & 0xff,
                         pPStack_60,(ulong)flags,(ulong)possibleSideEffects);
      type = (DynamicType *)(ulong)uVar3;
LAB_00e54715:
      iVar10 = (int)local_38;
    }
    else {
      pSVar6 = ConvertToNonSharedSimpleType(this,instance);
      if (type->isLocked != true) goto LAB_00e54715;
      iVar10 = (int)local_38;
      if ((DynamicType *)(instance->super_RecyclableObject).type.ptr == type) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        type = (DynamicType *)__tls_get_addr(&PTR_0155fe48);
        (type->super_Type).typeId = TypeIds_Null;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                    ,0x3fb,
                                    "(!oldType->GetIsLocked() || instance->GetDynamicType() != oldType)"
                                    ,
                                    "!oldType->GetIsLocked() || instance->GetDynamicType() != oldType"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        (type->super_Type).typeId = TypeIds_Undefined;
        iVar10 = (int)local_38;
      }
    }
    BVar4 = (BOOL)type;
    if ((char)local_50 == '\0') {
      uVar8 = (ulong)local_48 & 0xffffffff;
      goto LAB_00e54731;
    }
    bVar2 = false;
  }
  if (!bVar2) {
    return BVar4;
  }
LAB_00e5480f:
  value_00 = local_78;
  DynamicTypeHandler::SetSlotUnchecked(local_40,iVar10,local_78);
  if (pPStack_60 != (PropertyValueInfo *)0x0) {
    bVar7 = *local_70;
    pPStack_60->m_instance = &local_40->super_RecyclableObject;
    pPStack_60->m_propertyIndex = (PropertyIndex)unaff_R14;
    pPStack_60->m_attributes = bVar7;
    pPStack_60->flags = InlineCacheNoFlags;
  }
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&this->super_DynamicTypeHandler,local_40,propertyId,value_00,possibleSideEffects);
  return 1;
}

Assistant:

BOOL SimpleTypeHandler<size>::SetPropertyWithAttributes(DynamicObject* instance, PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        PropertyIndex index;
        if (GetDescriptor(propertyId, &index))
        {
            if (descriptors[index].Attributes != attributes)
            {
                SimpleTypeHandler * typeHandler = this;
                if (GetIsLocked())
                {
                    DynamicType* oldType = instance->GetDynamicType();
                    if (DoConvertToPathType(oldType))
                    {
                        return this->ConvertToPathType(instance)->SetPropertyWithAttributes(instance, propertyId, value, attributes, info, flags, possibleSideEffects);
                    }
                    else
                    {
                        // Don't attempt to share cross-site function types
                        typeHandler = this->ConvertToNonSharedSimpleType(instance);
                    }
                    Assert(!oldType->GetIsLocked() || instance->GetDynamicType() != oldType);
                }
                if (descriptors[index].Attributes & PropertyDeleted)
                {
                    instance->GetScriptContext()->InvalidateProtoCaches(propertyId);
                }
                typeHandler->descriptors[index].Attributes = attributes;
                if (attributes & PropertyEnumerable)
                {
                    instance->SetHasNoEnumerableProperties(false);
                }
                JavascriptLibrary * library = instance->GetLibrary();
                library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(typeHandler, attributes, propertyId, library->GetScriptContext());
            }
            SetSlotUnchecked(instance, index, value);
            PropertyValueInfo::Set(info, instance, static_cast<PropertyIndex>(index), descriptors[index].Attributes);
            SetPropertyUpdateSideEffect(instance, propertyId, value, possibleSideEffects);
            return true;
        }

        // Always check numeric propertyId. May create objectArray.
        ScriptContext* scriptContext = instance->GetScriptContext();
        uint32 indexVal;
        if (scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return SimpleTypeHandler<size>::SetItemWithAttributes(instance, indexVal, value, attributes);
        }

        return this->AddProperty(instance, propertyId, value, attributes, info, flags, possibleSideEffects);
    }